

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

int xcb_input_feedback_ctl_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_feedback_ctl_data_t *_aux)

{
  uint uVar1;
  anon_struct_8_2_3f0cf693_for_led *paVar2;
  void *__dest;
  uint32_t uVar3;
  int iVar4;
  undefined7 in_register_00000031;
  anon_struct_8_2_3f0cf693_for_led aVar5;
  ulong uVar6;
  size_t __n;
  int iVar7;
  long in_FS_OFFSET;
  char xcb_pad0 [3];
  iovec xcb_parts [24];
  undefined1 local_1bc [4];
  xcb_input_feedback_ctl_data_t *local_1b8;
  anon_struct_8_2_3f0cf693_for_led local_1b0;
  uint32_t *local_1a8;
  anon_struct_8_2_3f0cf693_for_led local_1a0;
  int16_t *local_198;
  anon_struct_8_2_3f0cf693_for_led local_190;
  anon_struct_8_4_64ea3a00_for_bell local_188;
  anon_struct_8_2_3f0cf693_for_led local_180;
  int16_t *local_178;
  undefined8 local_170;
  int16_t *local_168;
  undefined8 local_160;
  uint32_t *local_158;
  undefined8 local_150;
  uint32_t *local_148;
  anon_struct_8_2_3f0cf693_for_led local_140 [34];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_1bc[2] = '\0';
  local_1bc[0] = '\0';
  local_1bc[1] = '\0';
  memset(&local_1b8,0xaa,0x180);
  switch(CONCAT71(in_register_00000031,class_id) & 0xffffffff) {
  case 0:
    paVar2 = local_140;
    local_1b8 = _aux;
    local_1b0.led_mask = 1;
    local_1b0.led_values = 0;
    local_1a8 = (uint32_t *)&(_aux->keyboard).auto_repeat_mode;
    local_1a0.led_mask = 1;
    local_1a0.led_values = 0;
    local_198 = (int16_t *)&(_aux->keyboard).key_click_percent;
    local_190.led_mask = 1;
    local_190.led_values = 0;
    local_188 = (anon_struct_8_4_64ea3a00_for_bell)&(_aux->keyboard).bell_percent;
    local_180.led_mask = 1;
    local_180.led_values = 0;
    local_178 = &(_aux->keyboard).bell_pitch;
    local_170 = 2;
    local_168 = &(_aux->keyboard).bell_duration;
    local_160 = 2;
    local_158 = &(_aux->keyboard).led_mask;
    local_150 = 4;
    local_148 = &(_aux->keyboard).led_values;
    uVar3 = 0x10;
    iVar7 = 8;
    goto LAB_0018767b;
  case 1:
    paVar2 = &local_180;
    local_1b8 = (xcb_input_feedback_ctl_data_t *)local_1bc;
    aVar5.led_mask = 2;
    aVar5.led_values = 0;
    local_1b0.led_mask = 2;
    local_1b0.led_values = 0;
    local_1a8 = (uint32_t *)&(_aux->pointer).num;
    local_1a0.led_mask = 2;
    local_1a0.led_values = 0;
    local_198 = &(_aux->pointer).denom;
    local_190.led_mask = 2;
    local_190.led_values = 0;
    local_188 = (anon_struct_8_4_64ea3a00_for_bell)&(_aux->pointer).threshold;
    uVar3 = 8;
    iVar7 = 4;
    uVar1 = 1;
    iVar4 = 0;
    break;
  case 2:
    paVar2 = &local_190;
    local_1b8 = (xcb_input_feedback_ctl_data_t *)local_1bc;
    local_1b0.led_mask = 2;
    local_1b0.led_values = 0;
    local_1a8 = (uint32_t *)&(_aux->string).num_keysyms;
    local_1a0.led_mask = 2;
    local_1a0.led_values = 0;
    local_198 = (int16_t *)(_aux->string).keysyms;
    aVar5 = (anon_struct_8_2_3f0cf693_for_led)((ulong)(_aux->string).num_keysyms << 2);
    uVar3 = aVar5.led_mask;
    uVar1 = 3;
    iVar4 = 4;
    iVar7 = 3;
    break;
  case 3:
    paVar2 = &local_1b0;
    local_1b8 = (xcb_input_feedback_ctl_data_t *)&_aux->integer;
    uVar3 = 4;
    iVar7 = 1;
    goto LAB_0018767b;
  case 4:
    paVar2 = &local_1a0;
    local_1b8 = (xcb_input_feedback_ctl_data_t *)&_aux->led;
    local_1b0.led_mask = 4;
    local_1b0.led_values = 0;
    local_1a8 = &(_aux->led).led_values;
    uVar3 = 8;
    iVar7 = 2;
LAB_0018767b:
    uVar1 = 3;
    iVar4 = 0;
    aVar5.led_mask = 4;
    aVar5.led_values = 0;
    break;
  case 5:
    paVar2 = &local_180;
    local_1b8 = (xcb_input_feedback_ctl_data_t *)&_aux->bell;
    local_1b0.led_mask = 1;
    local_1b0.led_values = 0;
    local_1a8 = (uint32_t *)local_1bc;
    local_1a0.led_mask = 3;
    local_1a0.led_values = 0;
    local_198 = &(_aux->bell).pitch;
    local_190.led_mask = 2;
    local_190.led_values = 0;
    local_188 = (anon_struct_8_4_64ea3a00_for_bell)&(_aux->bell).duration;
    uVar3 = 8;
    iVar7 = 4;
    uVar1 = 1;
    iVar4 = 0;
    aVar5.led_mask = 2;
    aVar5.led_values = 0;
    break;
  default:
    uVar1 = 0xffffffff;
    iVar4 = 0;
    iVar7 = 0;
    uVar3 = 0;
    goto LAB_0018772f;
  }
  *paVar2 = aVar5;
LAB_0018772f:
  uVar1 = -uVar3 & uVar1;
  if (uVar1 != 0) {
    *(undefined1 **)((long)&local_1b8 + (ulong)(uint)(iVar7 << 4)) = local_1bc;
    *(ulong *)((long)&local_1b0.led_mask + (ulong)(uint)(iVar7 << 4)) = (ulong)uVar1;
    iVar7 = iVar7 + 1;
  }
  uVar1 = iVar4 + uVar3 + uVar1;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar1);
    *_buffer = __dest;
  }
  if (iVar7 != 0) {
    uVar6 = 0;
    do {
      __n = *(size_t *)((long)&local_1b0.led_mask + uVar6);
      if (*(void **)((long)&local_1b8 + uVar6) != (void *)0x0) {
        if (__n == 0) {
          __n = 0;
        }
        else {
          memcpy(__dest,*(void **)((long)&local_1b8 + uVar6),__n);
        }
      }
      __dest = (void *)((long)__dest + __n);
      uVar6 = uVar6 + 0x10;
    } while ((uint)(iVar7 << 4) != uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return uVar1;
}

Assistant:

int
xcb_input_feedback_ctl_data_serialize (void                                **_buffer,
                                       uint8_t                               class_id,
                                       const xcb_input_feedback_ctl_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 0;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[24];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_FEEDBACK_CLASS_KEYBOARD) {
        /* xcb_input_feedback_ctl_data_t.keyboard.key */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key;
        xcb_block_len += sizeof(xcb_input_key_code_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(xcb_input_key_code_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_input_key_code_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.auto_repeat_mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.auto_repeat_mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.key_click_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.key_click_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.bell_duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.bell_duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.keyboard.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->keyboard.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_POINTER) {
        /* xcb_input_feedback_ctl_data_t.pointer.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.pointer.num */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.num;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.denom */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.denom;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.pointer.threshold */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->pointer.threshold;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_STRING) {
        /* xcb_input_feedback_ctl_data_t.string.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*2;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*2;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.string.num_keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->string.num_keysyms;
        xcb_block_len += sizeof(uint16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint16_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* keysyms */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->string.keysyms;
        xcb_block_len += _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->string.num_keysyms * sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(xcb_keysym_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_INTEGER) {
        /* xcb_input_feedback_ctl_data_t.integer.int_to_display */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->integer.int_to_display;
        xcb_block_len += sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_LED) {
        /* xcb_input_feedback_ctl_data_t.led.led_mask */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_mask;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
        /* xcb_input_feedback_ctl_data_t.led.led_values */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->led.led_values;
        xcb_block_len += sizeof(uint32_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint32_t);
    }
    if(class_id == XCB_INPUT_FEEDBACK_CLASS_BELL) {
        /* xcb_input_feedback_ctl_data_t.bell.percent */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.percent;
        xcb_block_len += sizeof(int8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pad2 */
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_block_len += sizeof(uint8_t)*3;
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t)*3;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_feedback_ctl_data_t.bell.pitch */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.pitch;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
        /* xcb_input_feedback_ctl_data_t.bell.duration */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->bell.duration;
        xcb_block_len += sizeof(int16_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(int16_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int16_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}